

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_CloseStream(PaStream *stream)

{
  PaUtilStreamRepresentation *pPVar1;
  undefined8 *puVar2;
  PaError PVar3;
  PaUtilStreamRepresentation *pPVar4;
  PaUtilStreamRepresentation **ppPVar5;
  
  PVar3 = PaUtil_ValidateStreamPointer(stream);
  ppPVar5 = &firstOpenStream_;
  pPVar4 = (PaUtilStreamRepresentation *)0x0;
  while (pPVar1 = *ppPVar5, pPVar1 != (PaUtilStreamRepresentation *)0x0) {
    if (pPVar1 == (PaUtilStreamRepresentation *)stream) {
      if (pPVar4 == (PaUtilStreamRepresentation *)0x0) {
        ppPVar5 = &firstOpenStream_;
      }
      else {
        ppPVar5 = &pPVar4->nextOpenStream;
      }
      *ppPVar5 = pPVar1->nextOpenStream;
      break;
    }
    pPVar4 = pPVar1;
    ppPVar5 = &pPVar1->nextOpenStream;
  }
  if (PVar3 == 0) {
    puVar2 = *(undefined8 **)((long)stream + 0x10);
    PVar3 = (*(code *)puVar2[4])(stream);
    if (PVar3 == 1) {
LAB_001077ad:
      PVar3 = (*(code *)*puVar2)(stream);
      return PVar3;
    }
    if (PVar3 == 0) {
      PVar3 = (*(code *)puVar2[3])(stream);
      if (PVar3 == 0) goto LAB_001077ad;
    }
  }
  return PVar3;
}

Assistant:

PaError Pa_CloseStream( PaStream* stream )
{
    PaUtilStreamInterface *interface;
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_CloseStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    /* always remove the open stream from our list, even if this function
        eventually returns an error. Otherwise CloseOpenStreams() will
        get stuck in an infinite loop */
    RemoveOpenStream( stream ); /* be sure to call this _before_ closing the stream */

    if( result == paNoError )
    {
        interface = PA_STREAM_INTERFACE(stream);

        /* abort the stream if it isn't stopped */
        result = interface->IsStopped( stream );
        if( result == 1 )
            result = paNoError;
        else if( result == 0 )
            result = interface->Abort( stream );

        if( result == paNoError )                 /** @todo REVIEW: shouldn't we close anyway? see: http://www.portaudio.com/trac/ticket/115 */
            result = interface->Close( stream );
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_CloseStream", result );

    return result;
}